

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_error(char *json,int domain,bson_json_error_code_t code)

{
  size_t sVar1;
  long lVar2;
  bson_error_t error;
  int local_210;
  int local_20c;
  
  sVar1 = strlen(json);
  lVar2 = bson_new_from_json(json,sVar1,&local_210);
  if (lVar2 == 0) {
    if (local_210 == 1) {
      if (local_20c == domain) {
        return;
      }
      goto LAB_00134cdf;
    }
  }
  else {
    test_bson_json_error_cold_1();
  }
  test_bson_json_error_cold_2();
LAB_00134cdf:
  test_bson_json_error_cold_3();
  return;
}

Assistant:

static void
test_bson_json_error (const char *json, int domain, bson_json_error_code_t code)
{
   bson_error_t error;
   bson_t *bson;

   bson = bson_new_from_json ((const uint8_t *) json, strlen (json), &error);

   BSON_ASSERT (!bson);
   BSON_ASSERT (error.domain == domain);
   BSON_ASSERT (error.code == code);
}